

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall
QtPrivate::QWellArray::paintCell(QWellArray *this,QPainter *p,int row,int col,QRect *rect)

{
  bool bVar1;
  int iVar2;
  QPalette *pQVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  QStyleOptionFocusRect opt;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 auStack_b0 [16];
  QObject *pQStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  undefined1 auStack_60 [16];
  QObject *pQStack_50;
  undefined8 local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QWidget::palette(&this->super_QWidget);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_88);
  QStyleOption::initFrom((QStyleOption *)local_88,&this->super_QWidget);
  pQVar4 = QWidget::style(&this->super_QWidget);
  iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,5,(QStyleOptionFrame *)local_88,this);
  local_48._4_4_ = 1;
  local_48._0_4_ = iVar2;
  local_78._0_4_ = (rect->x1).m_i + 3;
  uStack_70._0_4_ = (rect->x2).m_i + -3;
  local_78._4_4_ = (rect->y1).m_i + 3;
  uStack_70._4_4_ = (rect->y2).m_i + -3;
  QPalette::operator=((QPalette *)auStack_60,pQVar3);
  local_88._8_4_ = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x5;
  pQVar4 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar4 + 0xb0))(pQVar4,0,(QStyleOptionFrame *)local_88,p,this);
  if ((this->curRow == row) && (this->curCol == col)) {
    bVar1 = QWidget::hasFocus(&this->super_QWidget);
    if (bVar1) {
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      auStack_b0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_a0 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      auStack_b0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFocusRect::QStyleOptionFocusRect((QStyleOptionFocusRect *)local_d8);
      QPalette::operator=((QPalette *)auStack_b0,pQVar3);
      local_c8._0_4_ = (rect->x1).m_i;
      local_c8._4_4_ = (rect->y1).m_i;
      puStack_c0._0_4_ = (rect->x2).m_i;
      puStack_c0._4_4_ = (rect->y2).m_i;
      local_d8._8_4_ = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x800000;
      pQVar4 = QWidget::style(&this->super_QWidget);
      (**(code **)(*(long *)pQVar4 + 0xb0))(pQVar4,3,(QStyleOptionFocusRect *)local_d8,p,this);
      QStyleOption::~QStyleOption((QStyleOption *)local_d8);
    }
  }
  local_d8._0_4_ = local_78._0_4_ + iVar2;
  local_d8._8_4_ = uStack_70._0_4_ - iVar2;
  local_d8._4_4_ = local_78._4_4_ + iVar2;
  local_d8._12_4_ = uStack_70._4_4_ - iVar2;
  (**(code **)(*(long *)&this->super_QWidget + 0x1b8))(this,p,row,col);
  QStyleOption::~QStyleOption((QStyleOption *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWellArray::paintCell(QPainter* p, int row, int col, const QRect &rect)
{
    int b = 3; //margin

    const QPalette & g = palette();
    QStyleOptionFrame opt;
    opt.initFrom(this);
    int dfw = style()->pixelMetric(QStyle::PM_DefaultFrameWidth, &opt, this);
    opt.lineWidth = dfw;
    opt.midLineWidth = 1;
    opt.rect = rect.adjusted(b, b, -b, -b);
    opt.palette = g;
    opt.state = QStyle::State_Enabled | QStyle::State_Sunken;
    style()->drawPrimitive(QStyle::PE_Frame, &opt, p, this);
    b += dfw;

    if ((row == curRow) && (col == curCol)) {
        if (hasFocus()) {
            QStyleOptionFocusRect opt;
            opt.palette = g;
            opt.rect = rect;
            opt.state = QStyle::State_None | QStyle::State_KeyboardFocusChange;
            style()->drawPrimitive(QStyle::PE_FrameFocusRect, &opt, p, this);
        }
    }
    paintCellContents(p, row, col, opt.rect.adjusted(dfw, dfw, -dfw, -dfw));
}